

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanFlowCollectionStart(Scanner *this,bool IsSequence)

{
  Token local_48;
  
  local_48.Value._M_dataplus._M_p = (pointer)&local_48.Value.field_2;
  local_48.Value._M_string_length = 0;
  local_48.Value.field_2._M_local_buf[0] = '\0';
  local_48.Kind = (uint)!IsSequence * 2 + TK_FlowSequenceStart;
  local_48.Range.Data = this->Current;
  local_48.Range.Length = 1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_48);
  saveSimpleKeyCandidate
            (this,(iterator)
                  (this->TokenQueue).List.Sentinel.
                  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                  .super_node_base_type.Prev,this->Column - 1,false);
  this->IsSimpleKeyAllowed = true;
  this->FlowLevel = this->FlowLevel + 1;
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanFlowCollectionStart(bool IsSequence) {
  Token T;
  T.Kind = IsSequence ? Token::TK_FlowSequenceStart
                      : Token::TK_FlowMappingStart;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);

  // [ and { may begin a simple key.
  saveSimpleKeyCandidate(--TokenQueue.end(), Column - 1, false);

  // And may also be followed by a simple key.
  IsSimpleKeyAllowed = true;
  ++FlowLevel;
  return true;
}